

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

void __thiscall
Fl_Text_Buffer::reallocate_with_gap(Fl_Text_Buffer *this,int newGapStart,int newGapLen)

{
  int iVar1;
  char *__dest;
  int newGapEnd;
  char *newBuf;
  int newGapLen_local;
  int newGapStart_local;
  Fl_Text_Buffer *this_local;
  
  __dest = (char *)malloc((long)(this->mLength + newGapLen));
  iVar1 = newGapStart + newGapLen;
  if (this->mGapStart < newGapStart) {
    memcpy(__dest,this->mBuf,(long)this->mGapStart);
    memcpy(__dest + this->mGapStart,this->mBuf + this->mGapEnd,(long)(newGapStart - this->mGapStart)
          );
    memcpy(__dest + iVar1,this->mBuf + ((this->mGapEnd + newGapStart) - this->mGapStart),
           (long)(this->mLength - newGapStart));
  }
  else {
    memcpy(__dest,this->mBuf,(long)newGapStart);
    memcpy(__dest + iVar1,this->mBuf + newGapStart,(long)(this->mGapStart - newGapStart));
    memcpy(__dest + ((iVar1 + this->mGapStart) - newGapStart),this->mBuf + this->mGapEnd,
           (long)(this->mLength - this->mGapStart));
  }
  free(this->mBuf);
  this->mBuf = __dest;
  this->mGapStart = newGapStart;
  this->mGapEnd = iVar1;
  return;
}

Assistant:

void Fl_Text_Buffer::reallocate_with_gap(int newGapStart, int newGapLen)
{
  char *newBuf = (char *) malloc(mLength + newGapLen);
  int newGapEnd = newGapStart + newGapLen;
  
  if (newGapStart <= mGapStart) {
    memcpy(newBuf, mBuf, newGapStart);
    memcpy(&newBuf[newGapEnd], &mBuf[newGapStart],
	   mGapStart - newGapStart);
    memcpy(&newBuf[newGapEnd + mGapStart - newGapStart],
	   &mBuf[mGapEnd], mLength - mGapStart);
  } else {			/* newGapStart > mGapStart */
    memcpy(newBuf, mBuf, mGapStart);
    memcpy(&newBuf[mGapStart], &mBuf[mGapEnd], newGapStart - mGapStart);
    memcpy(&newBuf[newGapEnd],
	   &mBuf[mGapEnd + newGapStart - mGapStart],
	   mLength - newGapStart);
  }
  free((void *) mBuf);
  mBuf = newBuf;
  mGapStart = newGapStart;
  mGapEnd = newGapEnd;
  }